

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O0

int BmsUtil::IsFileUTF8(string *filename)

{
  FILE *filename_00;
  bool bVar1;
  int iVar2;
  char *filename_01;
  BmsFileOpenException *this;
  uint *puVar3;
  size_t sVar4;
  int *piVar5;
  size_t *psStack_5068;
  int iconv_ret;
  char *but_out_iconv;
  ICONVCHR *buf_iconv;
  iconv_t pvStack_5050;
  int i;
  iconv_t cd;
  size_t len_char_out;
  size_t len_char;
  char buf_char_out [10240];
  char buf_char [10240];
  FILE *local_20;
  FILE *file;
  string *filename_local;
  
  file = (FILE *)filename;
  filename_01 = (char *)std::__cxx11::string::c_str();
  bVar1 = OpenFile((FILE **)&local_20,filename_01,"r");
  if (!bVar1) {
    this = (BmsFileOpenException *)__cxa_allocate_exception(0x30);
    filename_00 = file;
    puVar3 = (uint *)__errno_location();
    BmsFileOpenException::BmsFileOpenException(this,(string *)filename_00,*puVar3);
    __cxa_throw(this,&BmsFileOpenException::typeinfo,BmsFileOpenException::~BmsFileOpenException);
  }
  fseek(local_20,0,0);
  sVar4 = fread(buf_char_out + 0x27f8,1,3,local_20);
  if ((sVar4 == 3) && (iVar2 = memcmp(buf_char_out + 0x27f8,utf8BOM,3), iVar2 == 0)) {
    return 1;
  }
  fseek(local_20,0,0);
  pvStack_5050 = iconv_open("UTF-8","Shift_JIS");
  if (pvStack_5050 == (iconv_t)0xffffffffffffffff) {
    filename_local._4_4_ = -1;
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0;
    buf_iconv._4_4_ = 0;
    while( true ) {
      bVar1 = false;
      if (buf_iconv._4_4_ < 10) {
        iVar2 = feof(local_20);
        bVar1 = iVar2 == 0;
      }
      if (!bVar1) {
        iconv_close(pvStack_5050);
        return 0;
      }
      fgets(buf_char_out + 0x27f8,0x2800,local_20);
      len_char_out = strlen(buf_char_out + 0x27f8);
      but_out_iconv = buf_char_out + 0x27f8;
      psStack_5068 = &len_char;
      cd = (iconv_t)0x2800;
      sVar4 = iconv(pvStack_5050,&but_out_iconv,&len_char_out,(char **)&stack0xffffffffffffaf98,
                    (size_t *)&cd);
      *(undefined1 *)((long)psStack_5068 + 1) = 0;
      *(undefined1 *)psStack_5068 = 0;
      piVar5 = __errno_location();
      if ((*piVar5 != 0) || ((int)sVar4 < 0)) break;
      buf_iconv._4_4_ = buf_iconv._4_4_ + 1;
    }
    iconv_close(pvStack_5050);
    filename_local._4_4_ = 1;
  }
  return filename_local._4_4_;
}

Assistant:

int BmsUtil::IsFileUTF8(const std::string& filename) {
	FILE *file;
	if (!OpenFile(&file, filename.c_str(), "r"))
		throw BmsFileOpenException(filename, errno);

	// buffers
	char buf_char[BmsConst::BMS_MAX_LINE_BUFFER];
	char buf_char_out[BmsConst::BMS_MAX_LINE_BUFFER];
	size_t len_char, len_char_out;

	// check 4 byte to see is it UTF8 BOM
	fseek(file, 0, SEEK_SET);
	if (fread(buf_char, 1, 3, file) == 3 && memcmp(buf_char, utf8BOM, 3) == 0) {
		return true;
	}
	// attempt to convert few lines
	fseek(file, 0, SEEK_SET);
	iconv_t cd = iconv_open(BmsBelOption::DEFAULT_UNICODE_ENCODING, BmsBelOption::DEFAULT_FALLBACK_ENCODING);
	if (cd == (void*)-1) {
		// conversion is not supported
		return -1;
	}
	errno = 0;
	for (int i = 0; i < BmsBelOption::CONVERT_ATTEMPT_LINES && NOT(feof(file)); i++) {
		fgets(buf_char, BmsConst::BMS_MAX_LINE_BUFFER, file);
		len_char = strlen(buf_char);
		ICONVCHR *buf_iconv = (ICONVCHR*)buf_char;
		char *but_out_iconv = (char*)buf_char_out;
		len_char_out = BmsConst::BMS_MAX_LINE_BUFFER;		// available characters for converting
		int iconv_ret = iconv(cd, &buf_iconv, &len_char, &but_out_iconv, &len_char_out);
		*but_out_iconv = *(but_out_iconv + 1) = 0;		// NULL terminal character
		if (errno || iconv_ret < 0) {
			iconv_close(cd);
			return 1;	// failed to convert Shift_JIS. maybe UTF-8?
		}
	}
	iconv_close(cd);
	return 0;
}